

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

anon_unknown_dwarf_1ee86 * __thiscall
anon_unknown.dwarf_1ee86::open_input_stream(anon_unknown_dwarf_1ee86 *this,char *filename)

{
  std::ifstream::ifstream(this);
  std::ios::exceptions((int)*(undefined8 *)(*(long *)this + -0x18) + (int)this);
  std::ifstream::open((char *)this,(_Ios_Openmode)filename);
  return this;
}

Assistant:

ifstream open_input_stream(const char* filename)
{
    ifstream stream;
    stream.exceptions(ios::eofbit | ios::failbit | ios::badbit);
    stream.open(filename, mode_input);

    return stream;
}